

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_sin>(Mat *a,Option *opt)

{
  long *in_RDI;
  int iVar1;
  float fVar2;
  float fVar3;
  int iVar6;
  ulong uVar4;
  ulong uVar5;
  float fVar7;
  float fVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  int iVar13;
  ulong uVar12;
  float fVar14;
  float fVar15;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_sin op;
  Mat *m;
  v4sf y2;
  v4sf z;
  v4sf poly_mask;
  v4sf swap_sign_bit;
  v4si emm2;
  v4si emm0;
  v4sf y;
  v4sf sign_bit;
  v4sf xmm3;
  v4sf xmm2;
  v4sf xmm1;
  ulong local_868;
  ulong uStack_860;
  int local_854;
  undefined8 local_850;
  undefined8 local_848;
  undefined8 local_840;
  undefined4 local_838;
  long local_830;
  undefined4 local_828;
  undefined4 local_824;
  undefined4 local_820;
  undefined4 local_81c;
  undefined4 local_818;
  undefined8 local_810;
  float *local_808;
  int local_800;
  int local_7fc;
  int local_7f8;
  int local_7f4;
  int local_7f0;
  int local_7ec;
  int local_7e8;
  undefined1 local_7e1 [9];
  long *local_7d8;
  undefined1 local_7cd;
  int local_7cc;
  undefined8 *local_7c0;
  undefined8 *local_7b8;
  undefined8 *local_7a8;
  float *local_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  float *local_788;
  long local_780;
  undefined4 local_774;
  long local_770;
  float *local_768;
  undefined4 local_75c;
  int local_758;
  int local_754;
  undefined8 *local_750;
  undefined4 local_744;
  long local_740;
  undefined8 *local_730;
  ulong *local_708;
  undefined1 *local_700;
  float *local_6f8;
  undefined1 *local_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  float local_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  ulong local_6c8;
  ulong uStack_6c0;
  ulong local_6b8;
  ulong uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  ulong uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  ulong local_678;
  ulong uStack_670;
  ulong local_668;
  ulong uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  ulong local_628;
  ulong uStack_620;
  ulong local_618;
  ulong uStack_610;
  ulong local_608;
  ulong uStack_600;
  ulong local_5f8;
  ulong uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  ulong local_5d8;
  ulong uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  ulong local_5b8;
  ulong uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  ulong local_588;
  ulong uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 *local_470;
  float *local_468;
  float *local_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  float local_438 [2];
  float afStack_430 [2];
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float *local_3b0;
  float *local_3a8;
  undefined8 *local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  float local_378 [2];
  float afStack_370 [2];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float *local_350;
  float *local_348;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  float local_318 [2];
  float afStack_310 [2];
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float *local_2f0;
  float *local_2e8;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  float local_2b8 [2];
  float afStack_2b0 [2];
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float *local_290;
  float *local_288;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  float local_258 [2];
  float afStack_250 [2];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 *local_230;
  ulong *local_228;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 *local_170;
  undefined8 *local_168;
  undefined8 *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  ulong local_138;
  ulong uStack_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined4 local_ec;
  undefined8 local_e8;
  ulong uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_88;
  ulong uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  ulong uStack_40;
  ulong local_38;
  ulong uStack_30;
  ulong local_28;
  ulong uStack_20;
  ulong local_18;
  ulong uStack_10;
  
  local_7e8 = *(int *)((long)in_RDI + 0x2c);
  local_7ec = (int)in_RDI[6];
  local_7f0 = *(int *)((long)in_RDI + 0x34);
  local_7f4 = (int)in_RDI[7];
  local_7f8 = (int)in_RDI[3];
  local_7fc = local_7e8 * local_7ec * local_7f0 * local_7f8;
  local_7d8 = in_RDI;
  for (local_800 = 0; local_800 < local_7f4; local_800 = local_800 + 1) {
    local_7c0 = &local_850;
    local_754 = *(int *)((long)local_7d8 + 0x2c);
    local_758 = (int)local_7d8[6];
    local_75c = *(undefined4 *)((long)local_7d8 + 0x34);
    local_768 = (float *)(*local_7d8 + local_7d8[8] * (long)local_800 * local_7d8[2]);
    local_770 = local_7d8[2];
    local_774 = (undefined4)local_7d8[3];
    local_780 = local_7d8[4];
    local_750 = &local_850;
    local_740 = (long)local_754 * (long)local_758 * local_770;
    local_7b8 = &local_850;
    local_7a8 = &local_850;
    local_744 = 0x10;
    local_7cc = local_800;
    local_7cd = 1;
    local_850 = 0;
    local_840 = 0;
    local_838 = 0;
    local_828 = 0;
    local_824 = 0;
    local_820 = 0;
    local_81c = 0;
    local_818 = 0;
    local_810 = 0;
    local_848 = 0;
    local_808 = local_768;
    for (local_854 = 0; local_730 = local_7a8, local_830 = local_780, local_854 + 3 < local_7fc;
        local_854 = local_854 + 4) {
      local_7a0 = local_808;
      local_5d8 = *(ulong *)local_808;
      uStack_5d0 = *(ulong *)(local_808 + 2);
      local_700 = local_7e1;
      local_708 = &local_868;
      local_5a8 = 0;
      uStack_5a0 = 0;
      local_5c8 = 0x7fffffff7fffffff;
      uStack_5c0 = 0x7fffffff7fffffff;
      local_138 = local_5d8 & 0x7fffffff7fffffff;
      uStack_130 = uStack_5d0 & 0x7fffffff7fffffff;
      local_5e8 = 0x8000000080000000;
      uStack_5e0 = 0x8000000080000000;
      local_18 = local_5d8 & 0x8000000080000000;
      uStack_10 = uStack_5d0 & 0x8000000080000000;
      local_4d8 = 0x3fa2f9833fa2f983;
      uStack_4d0 = 0x3fa2f9833fa2f983;
      local_4c8._0_4_ = (float)local_138;
      local_4c8._4_4_ = (float)(local_138 >> 0x20);
      uStack_4c0._0_4_ = (float)uStack_130;
      uStack_4c0._4_4_ = (float)(uStack_130 >> 0x20);
      local_688 = CONCAT44(local_4c8._4_4_ * 1.2732395,(float)local_4c8 * 1.2732395);
      uStack_680 = CONCAT44(uStack_4c0._4_4_ * 1.2732395,(float)uStack_4c0 * 1.2732395);
      local_568 = local_688;
      uStack_560 = uStack_680;
      iVar1 = (int)((float)local_4c8 * 1.2732395);
      iVar6 = (int)(local_4c8._4_4_ * 1.2732395);
      iVar9 = (int)((float)uStack_4c0 * 1.2732395);
      iVar13 = (int)(uStack_4c0._4_4_ * 1.2732395);
      local_6a8 = CONCAT44(iVar6,iVar1);
      uStack_6a0 = CONCAT44(iVar13,iVar9);
      local_108 = local_6a8;
      uStack_100 = uStack_6a0;
      local_118 = 0x100000001;
      uStack_110 = 0x100000001;
      local_6a8 = CONCAT44(iVar6 + 1,iVar1 + 1);
      uStack_6a0 = CONCAT44(iVar13 + 1,iVar9 + 1);
      local_88 = local_6a8;
      uStack_80 = uStack_6a0;
      local_98 = 0xfffffffefffffffe;
      uStack_90 = 0xfffffffefffffffe;
      local_c8 = local_6a8 & 0xfffffffefffffffe;
      uStack_c0 = uStack_6a0 & 0xfffffffefffffffe;
      local_578._0_4_ = (int)local_c8;
      local_578._4_4_ = (int)(local_c8 >> 0x20);
      uStack_570._0_4_ = (int)uStack_c0;
      uStack_570._4_4_ = (int)(uStack_c0 >> 0x20);
      local_1e8 = (float)(int)local_578;
      fStack_1e4 = (float)local_578._4_4_;
      fStack_1e0 = (float)(int)uStack_570;
      fStack_1dc = (float)uStack_570._4_4_;
      local_688 = CONCAT44(fStack_1e4,local_1e8);
      uStack_680 = CONCAT44(fStack_1dc,fStack_1e0);
      local_b8 = 0x400000004;
      uStack_b0 = 0x400000004;
      uVar4 = local_6a8 & 0x400000004;
      uStack_6b0 = uStack_6a0 & 0x400000004;
      local_ec = 0x1d;
      local_e8._0_4_ = (int)uVar4;
      local_e8._4_4_ = (undefined4)(uVar4 >> 0x20);
      local_698 = CONCAT44(local_e8._4_4_,(int)local_e8 << 0x1d);
      local_d8 = 0x200000002;
      uStack_d0 = 0x200000002;
      uVar5 = local_6a8 & 0x200000002;
      uVar12 = uStack_6a0 & 0x200000002;
      local_58 = 0;
      uStack_50 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_68._0_4_ = (int)uVar5;
      local_68._4_4_ = (int)(uVar5 >> 0x20);
      uStack_60._0_4_ = (int)uVar12;
      uStack_60._4_4_ = (int)(uVar12 >> 0x20);
      local_6a8 = CONCAT44(-(uint)(local_68._4_4_ == 0),-(uint)((int)local_68 == 0));
      uStack_6a0 = CONCAT44(-(uint)(uStack_60._4_4_ == 0),-(uint)((int)uStack_60 == 0));
      local_618 = local_698;
      local_6b8 = local_698;
      local_628 = local_6a8;
      uStack_620 = uStack_6a0;
      local_6c8 = local_6a8;
      uStack_6c0 = uStack_6a0;
      local_28 = local_698;
      local_678 = local_18 ^ local_698;
      uStack_670 = uStack_10 ^ uStack_6b0;
      local_648 = 0xbf490000bf490000;
      uStack_640 = 0xbf490000bf490000;
      local_658 = 0xb97da000b97da000;
      uStack_650 = 0xb97da000b97da000;
      local_470 = &local_688;
      local_168 = &local_648;
      local_410 = &local_638;
      local_148 = local_688;
      uStack_140 = uStack_680;
      local_158 = 0xbf490000bf490000;
      uStack_150 = 0xbf490000bf490000;
      local_128 = local_1e8 * -0.78515625;
      fStack_124 = fStack_1e4 * -0.78515625;
      fStack_120 = fStack_1e0 * -0.78515625;
      fStack_11c = fStack_1dc * -0.78515625;
      local_638 = CONCAT44(fStack_124 + local_4c8._4_4_,local_128 + (float)local_4c8);
      uStack_630 = CONCAT44(fStack_11c + uStack_4c0._4_4_,fStack_120 + (float)uStack_4c0);
      local_1c8 = &local_658;
      local_1a8 = local_688;
      uStack_1a0 = uStack_680;
      local_1b8 = 0xb97da000b97da000;
      uStack_1b0 = 0xb97da000b97da000;
      local_188 = local_1e8 * -0.00024187565;
      fStack_184 = fStack_1e4 * -0.00024187565;
      fStack_180 = fStack_1e0 * -0.00024187565;
      fStack_17c = fStack_1dc * -0.00024187565;
      local_198 = local_638;
      uStack_190 = uStack_630;
      fVar2 = local_188 + local_128 + (float)local_4c8;
      fVar7 = fStack_184 + fStack_124 + local_4c8._4_4_;
      fVar10 = fStack_180 + fStack_120 + (float)uStack_4c0;
      fVar14 = fStack_17c + fStack_11c + uStack_4c0._4_4_;
      local_638 = CONCAT44(fVar7,fVar2);
      uStack_630 = CONCAT44(fVar14,fVar10);
      local_228 = &local_668;
      local_208 = local_688;
      uStack_200 = uStack_680;
      local_218 = 0xb3222169b3222169;
      uStack_210 = 0xb3222169b3222169;
      local_1e8 = local_1e8 * -3.774895e-08;
      fStack_1e4 = fStack_1e4 * -3.774895e-08;
      fStack_1e0 = fStack_1e0 * -3.774895e-08;
      fStack_1dc = fStack_1dc * -3.774895e-08;
      local_1f8 = local_638;
      uStack_1f0 = uStack_630;
      fVar2 = local_1e8 + fVar2;
      fVar7 = fStack_1e4 + fVar7;
      fVar10 = fStack_1e0 + fVar10;
      fVar14 = fStack_1dc + fVar14;
      local_638 = CONCAT44(fVar7,fVar2);
      uStack_630 = CONCAT44(fVar14,fVar10);
      local_4f8 = local_638;
      uStack_4f0 = uStack_630;
      local_6d8 = fVar2 * fVar2;
      fStack_6d4 = fVar7 * fVar7;
      fStack_6d0 = fVar10 * fVar10;
      fStack_6cc = fVar14 * fVar14;
      local_460 = &local_6d8;
      local_290 = _ps_coscof_p1;
      local_268 = 0x37ccf5ce37ccf5ce;
      uStack_260 = 0x37ccf5ce37ccf5ce;
      local_278 = CONCAT44(fStack_6d4,local_6d8);
      uStack_270 = CONCAT44(fStack_6cc,fStack_6d0);
      local_248 = local_6d8 * 2.4433157e-05;
      fStack_244 = fStack_6d4 * 2.4433157e-05;
      fStack_240 = fStack_6d0 * 2.4433157e-05;
      fStack_23c = fStack_6cc * 2.4433157e-05;
      local_258[0] = -0.0013887316;
      local_258[1] = -0.0013887316;
      afStack_250[0] = -0.0013887316;
      afStack_250[1] = -0.0013887316;
      local_688 = CONCAT44(fStack_244 + -0.0013887316,local_248 + -0.0013887316);
      uStack_680 = CONCAT44(fStack_23c + -0.0013887316,fStack_240 + -0.0013887316);
      local_2f0 = _ps_coscof_p2;
      local_2c8 = local_688;
      uStack_2c0 = uStack_680;
      local_2d8 = CONCAT44(fStack_6d4,local_6d8);
      uStack_2d0 = CONCAT44(fStack_6cc,fStack_6d0);
      local_2a8 = (local_248 + -0.0013887316) * local_6d8;
      fStack_2a4 = (fStack_244 + -0.0013887316) * fStack_6d4;
      fStack_2a0 = (fStack_240 + -0.0013887316) * fStack_6d0;
      fStack_29c = (fStack_23c + -0.0013887316) * fStack_6cc;
      local_2b8[0] = 0.041666646;
      local_2b8[1] = 0.041666646;
      afStack_2b0[0] = 0.041666646;
      afStack_2b0[1] = 0.041666646;
      local_688 = CONCAT44(fStack_2a4 + 0.041666646,local_2a8 + 0.041666646);
      uStack_680 = CONCAT44(fStack_29c + 0.041666646,fStack_2a0 + 0.041666646);
      local_508 = local_688;
      uStack_500 = uStack_680;
      local_518 = CONCAT44(fStack_6d4,local_6d8);
      uStack_510 = CONCAT44(fStack_6cc,fStack_6d0);
      fVar3 = (local_2a8 + 0.041666646) * local_6d8;
      fVar8 = (fStack_2a4 + 0.041666646) * fStack_6d4;
      fVar11 = (fStack_2a0 + 0.041666646) * fStack_6d0;
      fVar15 = (fStack_29c + 0.041666646) * fStack_6cc;
      local_688 = CONCAT44(fVar8,fVar3);
      uStack_680 = CONCAT44(fVar15,fVar11);
      local_528 = local_688;
      uStack_520 = uStack_680;
      local_538 = CONCAT44(fStack_6d4,local_6d8);
      uStack_530 = CONCAT44(fStack_6cc,fStack_6d0);
      fVar3 = fVar3 * local_6d8;
      fVar8 = fVar8 * fStack_6d4;
      fVar11 = fVar11 * fStack_6d0;
      fVar15 = fVar15 * fStack_6cc;
      local_688 = CONCAT44(fVar8,fVar3);
      uStack_680 = CONCAT44(fVar15,fVar11);
      local_468 = ::_ps_0p5;
      local_448 = local_688;
      uStack_440 = uStack_680;
      local_428 = CONCAT44(fStack_6d4,local_6d8);
      uStack_420 = CONCAT44(fStack_6cc,fStack_6d0);
      local_438[0] = 0.5;
      local_438[1] = 0.5;
      afStack_430[0] = 0.5;
      afStack_430[1] = 0.5;
      local_458 = local_6d8 * 0.5;
      fStack_454 = fStack_6d4 * 0.5;
      fStack_450 = fStack_6d0 * 0.5;
      fStack_44c = fStack_6cc * 0.5;
      fVar3 = fVar3 - local_458;
      fVar8 = fVar8 - fStack_454;
      fVar11 = fVar11 - fStack_450;
      fVar15 = fVar15 - fStack_44c;
      local_688 = CONCAT44(fVar8,fVar3);
      uStack_680 = CONCAT44(fVar15,fVar11);
      local_488 = local_688;
      uStack_480 = uStack_680;
      local_498 = 0x3f8000003f800000;
      uStack_490 = 0x3f8000003f800000;
      fVar3 = fVar3 + 1.0;
      fVar8 = fVar8 + 1.0;
      fVar11 = fVar11 + 1.0;
      fVar15 = fVar15 + 1.0;
      local_688 = CONCAT44(fVar8,fVar3);
      uStack_680 = CONCAT44(fVar15,fVar11);
      local_400 = &local_6e8;
      local_350 = _ps_sincof_p1;
      local_328 = 0xb94ca1f9b94ca1f9;
      uStack_320 = 0xb94ca1f9b94ca1f9;
      local_338 = CONCAT44(fStack_6d4,local_6d8);
      uStack_330 = CONCAT44(fStack_6cc,fStack_6d0);
      local_308 = local_6d8 * -0.00019515296;
      fStack_304 = fStack_6d4 * -0.00019515296;
      fStack_300 = fStack_6d0 * -0.00019515296;
      fStack_2fc = fStack_6cc * -0.00019515296;
      local_318[0] = 0.008332161;
      local_318[1] = 0.008332161;
      afStack_310[0] = 0.008332161;
      afStack_310[1] = 0.008332161;
      local_6e8 = CONCAT44(fStack_304 + 0.008332161,local_308 + 0.008332161);
      uStack_6e0 = CONCAT44(fStack_2fc + 0.008332161,fStack_300 + 0.008332161);
      local_3b0 = _ps_sincof_p2;
      local_388 = local_6e8;
      uStack_380 = uStack_6e0;
      local_398 = CONCAT44(fStack_6d4,local_6d8);
      uStack_390 = CONCAT44(fStack_6cc,fStack_6d0);
      local_368 = (local_308 + 0.008332161) * local_6d8;
      fStack_364 = (fStack_304 + 0.008332161) * fStack_6d4;
      fStack_360 = (fStack_300 + 0.008332161) * fStack_6d0;
      fStack_35c = (fStack_2fc + 0.008332161) * fStack_6cc;
      local_378[0] = -0.16666655;
      local_378[1] = -0.16666655;
      afStack_370[0] = -0.16666655;
      afStack_370[1] = -0.16666655;
      local_6e8 = CONCAT44(fStack_364 + -0.16666655,local_368 + -0.16666655);
      uStack_6e0 = CONCAT44(fStack_35c + -0.16666655,fStack_360 + -0.16666655);
      local_548 = local_6e8;
      uStack_540 = uStack_6e0;
      local_558 = CONCAT44(fStack_6d4,local_6d8);
      uStack_550 = CONCAT44(fStack_6cc,fStack_6d0);
      local_3c8 = (local_368 + -0.16666655) * local_6d8;
      fStack_3c4 = (fStack_364 + -0.16666655) * fStack_6d4;
      fStack_3c0 = (fStack_360 + -0.16666655) * fStack_6d0;
      fStack_3bc = (fStack_35c + -0.16666655) * fStack_6cc;
      local_6e8 = CONCAT44(fStack_3c4,local_3c8);
      uStack_6e0 = CONCAT44(fStack_3bc,fStack_3c0);
      local_3e8 = local_6e8;
      uStack_3e0 = uStack_6e0;
      local_3f8 = local_638;
      uStack_3f0 = uStack_630;
      local_3c8 = local_3c8 * fVar2;
      fStack_3c4 = fStack_3c4 * fVar7;
      fStack_3c0 = fStack_3c0 * fVar10;
      fStack_3bc = fStack_3bc * fVar14;
      local_3d8 = local_638;
      uStack_3d0 = uStack_630;
      local_6e8 = CONCAT44(fStack_3c4 + fVar7,local_3c8 + fVar2);
      uStack_6e0 = CONCAT44(fStack_3bc + fVar14,fStack_3c0 + fVar10);
      local_668 = local_6a8;
      uStack_660 = uStack_6a0;
      local_5f8 = local_6a8;
      uStack_5f0 = uStack_6a0;
      local_608 = local_6e8;
      uStack_600 = uStack_6e0;
      local_6e8 = local_6a8 & local_6e8;
      uStack_6e0 = uStack_6a0 & uStack_6e0;
      local_588 = local_6a8;
      uStack_580 = uStack_6a0;
      local_598 = local_688;
      uStack_590 = uStack_680;
      fVar3 = (float)((-(uint)((int)local_68 == 0) ^ 0xffffffff) & (uint)fVar3);
      fVar8 = (float)((-(uint)(local_68._4_4_ == 0) ^ 0xffffffff) & (uint)fVar8);
      fVar11 = (float)((-(uint)((int)uStack_60 == 0) ^ 0xffffffff) & (uint)fVar11);
      fVar15 = (float)((-(uint)(uStack_60._4_4_ == 0) ^ 0xffffffff) & (uint)fVar15);
      local_688 = CONCAT44(fVar8,fVar3);
      uStack_680 = CONCAT44(fVar15,fVar11);
      local_4a8 = local_688;
      uStack_4a0 = uStack_680;
      local_4b8._0_4_ = (float)local_6e8;
      local_4b8._4_4_ = (float)(local_6e8 >> 0x20);
      uStack_4b0._0_4_ = (float)uStack_6e0;
      uStack_4b0._4_4_ = (float)(uStack_6e0 >> 0x20);
      local_688 = CONCAT44(fVar8 + local_4b8._4_4_,fVar3 + (float)local_4b8);
      uStack_680 = CONCAT44(fVar15 + uStack_4b0._4_4_,fVar11 + (float)uStack_4b0);
      local_38 = local_688;
      uStack_30 = uStack_680;
      local_868 = local_688 ^ local_678;
      uStack_860 = uStack_680 ^ uStack_670;
      local_788 = local_808;
      local_798._0_4_ = (float)local_868;
      local_798._4_4_ = (float)(local_868 >> 0x20);
      uStack_790._0_4_ = (float)uStack_860;
      uStack_790._4_4_ = (float)(uStack_860 >> 0x20);
      *local_808 = (float)local_798;
      local_808[1] = local_798._4_4_;
      local_808[2] = (float)uStack_790;
      local_808[3] = uStack_790._4_4_;
      local_808 = local_808 + 4;
      local_798 = local_868;
      uStack_790 = uStack_860;
      uStack_690 = uStack_6b0;
      local_688 = local_868;
      uStack_680 = uStack_860;
      uStack_610 = uStack_6b0;
      local_5b8 = local_5d8;
      uStack_5b0 = uStack_5d0;
      local_578 = local_c8;
      uStack_570 = uStack_c0;
      local_4e8 = local_4f8;
      uStack_4e0 = uStack_4f0;
      local_4c8 = local_138;
      uStack_4c0 = uStack_130;
      local_4b8 = local_6e8;
      uStack_4b0 = uStack_6e0;
      local_408 = local_410;
      local_3a8 = local_460;
      local_3a0 = local_400;
      local_348 = local_460;
      local_340 = local_400;
      local_2e8 = local_460;
      local_2e0 = local_470;
      local_288 = local_460;
      local_280 = local_470;
      local_230 = local_410;
      local_220 = local_470;
      local_1d0 = local_410;
      local_1c0 = local_470;
      local_170 = local_410;
      local_160 = local_470;
      local_e8 = uVar4;
      uStack_e0 = uStack_6b0;
      local_a8 = local_c8;
      uStack_a0 = uStack_c0;
      local_68 = uVar5;
      uStack_60 = uVar12;
      local_48 = local_678;
      uStack_40 = uStack_670;
      uStack_20 = uStack_6b0;
    }
    for (; local_854 < local_7fc; local_854 = local_854 + 1) {
      local_6f0 = local_7e1;
      local_6f8 = local_808;
      fVar2 = sinf(*local_808);
      *local_808 = fVar2;
      local_808 = local_808 + 1;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}